

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void ravi_closure_setenv(lua_State *L)

{
  lua_CFunction p_Var1;
  Value *pVVar2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  TValue *gt;
  Table *reg;
  LClosure *f;
  lua_State *L_local;
  
  if (L->top[-1].tt_ != 0x8006) {
    __assert_fail("((((L->top - 1))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x536,"void ravi_closure_setenv(lua_State *)");
  }
  if ((L->top[-1].value_.gc)->tt != '\x06') {
    __assert_fail("(((L->top - 1)->value_).gc)->tt == ((6) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x536,"void ravi_closure_setenv(lua_State *)");
  }
  p_Var1 = L->top[-1].value_.f;
  if (p_Var1[10] != (_func_int_lua_State_ptr)0x0) {
    if ((L->l_G->l_registry).tt_ != 0x8005) {
      __assert_fail("((((&(L->l_G)->l_registry))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x539,"void ravi_closure_setenv(lua_State *)");
    }
    if (((L->l_G->l_registry).value_.gc)->tt != '\x05') {
      __assert_fail("(((&(L->l_G)->l_registry)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x539,"void ravi_closure_setenv(lua_State *)");
    }
    pTVar3 = luaH_getint((Table *)(L->l_G->l_registry).value_.gc,2);
    pVVar2 = (Value *)**(long **)(p_Var1 + 0x20);
    *pVVar2 = pTVar3->value_;
    *(LuaType *)(pVVar2 + 1) = pTVar3->tt_;
    if (((ulong)pVVar2[1] & 0x8000) != 0) {
      if (((ulong)pVVar2[1] & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x53c,"void ravi_closure_setenv(lua_State *)");
      }
      if ((*(ushort *)(pVVar2 + 1) & 0x7f) != (ushort)pVVar2->gc->tt) {
LAB_0011ddae:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x53c,"void ravi_closure_setenv(lua_State *)");
      }
      if (L != (lua_State *)0x0) {
        if (((ulong)pVVar2[1] & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x53c,"void ravi_closure_setenv(lua_State *)");
        }
        if ((pVVar2->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0011ddae;
      }
    }
    if (((pTVar3->tt_ & 0x8000) != 0) &&
       (**(long **)(p_Var1 + 0x20) == *(long *)(p_Var1 + 0x20) + 0x10)) {
      if ((pTVar3->tt_ & 0x8000) == 0) {
        __assert_fail("(((gt)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x53d,"void ravi_closure_setenv(lua_State *)");
      }
      luaC_upvalbarrier_(L,(pTVar3->value_).gc);
    }
  }
  return;
}

Assistant:

LUA_API void ravi_closure_setenv(lua_State* L) {
  LClosure *f = clLvalue(L->top - 1);  /* get newly created function */
  if (f->nupvalues >= 1) {  /* does it have an upvalue? */
    /* get global table from registry */
    Table *reg = hvalue(&G(L)->l_registry);
    const TValue *gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
    /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
    setobj(L, f->upvals[0]->v, gt);
    luaC_upvalbarrier(L, f->upvals[0], gt);
  }
}